

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_log_area_ratio.cc
# Opt level: O3

bool __thiscall
sptk::ParcorCoefficientsToLogAreaRatio::Run
          (ParcorCoefficientsToLogAreaRatio *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *log_area_ratio)

{
  double *pdVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  double *pdVar5;
  size_type __new_size;
  double *pdVar6;
  double dVar7;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if (log_area_ratio != (vector<double,_std::allocator<double>_> *)0x0) {
      iVar2 = this->num_order_;
      pdVar6 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6;
      __new_size = lVar3 >> 3;
      bVar4 = false;
      if (__new_size == (long)iVar2 + 1U) {
        pdVar5 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar5 != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize(log_area_ratio,__new_size);
          pdVar6 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = this->num_order_;
        }
        *pdVar5 = *pdVar6;
        bVar4 = true;
        if (iVar2 != 0) {
          pdVar1 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          while (pdVar6 = pdVar6 + 1, pdVar6 != pdVar1) {
            pdVar5 = pdVar5 + 1;
            dVar7 = atanh(*pdVar6);
            *pdVar5 = dVar7 + dVar7;
          }
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ParcorCoefficientsToLogAreaRatio::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* log_area_ratio) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == log_area_ratio) {
    return false;
  }

  // Prepare memories.
  if (log_area_ratio->size() != static_cast<std::size_t>(length)) {
    log_area_ratio->resize(length);
  }

  // Copy gain.
  (*log_area_ratio)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  std::transform(parcor_coefficients.begin() + 1, parcor_coefficients.end(),
                 log_area_ratio->begin() + 1,
                 [](double k) { return 2.0 * std::atanh(k); });

  return true;
}